

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool bitset_bitset_container_ixor
                (bitset_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  int iVar1;
  array_container_t *paVar2;
  
  iVar1 = bitset_container_xor(src_1,src_2,src_1);
  if (iVar1 < 0x1001) {
    paVar2 = array_container_from_bitset(src_1);
    *dst = paVar2;
    bitset_container_free(src_1);
  }
  else {
    *dst = src_1;
  }
  return 0x1000 < iVar1;
}

Assistant:

bool bitset_bitset_container_ixor(bitset_container_t *src_1,
                                  const bitset_container_t *src_2,
                                  container_t **dst) {
    int card = bitset_container_xor(src_1, src_2, src_1);
    if (card <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(src_1);
        bitset_container_free(src_1);
        return false;  // not bitset
    } else {
        *dst = src_1;
        return true;
    }
}